

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

void * xmlFileOpenW(char *filename)

{
  int iVar1;
  FILE *fd;
  char *path;
  char *filename_local;
  
  iVar1 = strcmp(filename,"-");
  if (iVar1 == 0) {
    filename_local = _stdout;
  }
  else {
    iVar1 = xmlStrncasecmp((xmlChar *)filename,(xmlChar *)"file://localhost/",0x11);
    if (iVar1 == 0) {
      fd = (FILE *)(filename + 0x10);
    }
    else {
      iVar1 = xmlStrncasecmp((xmlChar *)filename,(xmlChar *)"file:///",8);
      fd = (FILE *)filename;
      if (iVar1 == 0) {
        fd = (FILE *)(filename + 7);
      }
    }
    if (fd == (FILE *)0x0) {
      filename_local = (char *)0x0;
    }
    else {
      filename_local = (char *)fopen64((char *)fd,"wb");
      if ((FILE *)filename_local == (FILE *)0x0) {
        xmlIOErr(0,(char *)fd);
      }
    }
  }
  return filename_local;
}

Assistant:

static void *
xmlFileOpenW (const char *filename) {
    const char *path = NULL;
    FILE *fd;

    if (!strcmp(filename, "-")) {
	fd = stdout;
	return((void *) fd);
    }

    if (!xmlStrncasecmp(BAD_CAST filename, BAD_CAST "file://localhost/", 17))
#if defined (_WIN32) || defined (__DJGPP__) && !defined(__CYGWIN__)
	path = &filename[17];
#else
	path = &filename[16];
#endif
    else if (!xmlStrncasecmp(BAD_CAST filename, BAD_CAST "file:///", 8)) {
#if defined (_WIN32) || defined (__DJGPP__) && !defined(__CYGWIN__)
	path = &filename[8];
#else
	path = &filename[7];
#endif
    }